

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::New(PageHeap *this,uint64_t n)

{
  mutex *__mutex;
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  Span *pSVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  
  __mutex = &this->lock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar6 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  pSVar4 = SearchSmallAndLarge(this,n);
  if (pSVar4 == (Span *)0x0) {
    uVar5 = (this->stat).normal_bytes;
    if (((uVar5 != 0) && (uVar1 = (this->stat).returned_bytes, uVar1 != 0)) &&
       ((this->stat).system_bytes >> 2 < uVar1 + uVar5)) {
      uVar5 = ReleaseNormalSpans(this,0x7fffffff);
      if (uVar5 != 0) {
        pSVar4 = SearchSmallAndLarge(this,n);
        if (pSVar4 != (Span *)0x0) goto LAB_00104b1f;
      }
    }
    bVar2 = GrowHeap(this,n);
    if (bVar2) {
      pSVar4 = SearchSmallAndLarge(this,n);
      if (pSVar4 != (Span *)0x0) goto LAB_00104b1f;
    }
    pSVar4 = (Span *)0x0;
  }
  else {
LAB_00104b1f:
    pSVar4 = Carve(this,pSVar4,n);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pSVar4;
}

Assistant:

Span* New(uint64_t n) {
        std::lock_guard<std::mutex> guard(lock);
        Span* span = nullptr;
        span = SearchSmallAndLarge(n);
        if (span != nullptr) {
            return Carve(span, n);
        }

        // 没找到，但是有很多空闲内存，尝试合并碎片之后再找。
        if ( stat.normal_bytes != 0 && stat.returned_bytes != 0 &&
        (stat.normal_bytes + stat.returned_bytes) > (stat.system_bytes/4) &&
                (ReleaseNormalSpans(0x7fffffff) > 0) )
        {
            span = SearchSmallAndLarge(n);
            if (span != nullptr) {
                return Carve(span, n);
            }
        }

        if (GrowHeap(n)) {
            span = SearchSmallAndLarge(n);
            if (span != nullptr) {
                return Carve(span, n);
            }
        }
        return nullptr;
    }